

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  buffer<char> *pbVar5;
  uint64_t divisor;
  int iVar6;
  result rVar7;
  ulong uVar8;
  long lVar9;
  decimal_fp<float> dVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  uint uVar17;
  uint64_t error;
  size_t __len;
  bool bVar18;
  decimal_fp<double> dVar19;
  int exp;
  fixed_handler handler;
  int local_7c;
  fixed_handler local_78;
  ulong local_60;
  buffer<char> *local_58;
  uint64_t local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar14 = (ulong)specs & 0xff00000000;
  local_78.fixed = uVar14 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar14 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      local_7c = 0;
    }
    else {
      uVar14 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar14) {
        (**buf->_vptr_buffer)(buf,uVar14);
      }
      uVar8 = buf->capacity_;
      if (uVar14 <= buf->capacity_) {
        uVar8 = uVar14;
      }
      buf->size_ = uVar8;
      memset(buf->ptr_,0x30,uVar14);
      local_7c = -precision;
    }
  }
  else {
    local_60 = (ulong)specs >> 0x20;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar6 = snprintf_float<double>(value,precision,specs,buf);
      return iVar6;
    }
    if (precision < 0) {
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        dVar19 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar19.significand);
        local_7c = dVar19.exponent;
      }
      else {
        dVar10 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar10.significand);
        local_7c = dVar10.exponent;
      }
    }
    else {
      local_7c = 0;
      uVar13 = (ulong)value & 0xfffffffffffff;
      bVar18 = (ulong)value >> 0x34 == 0;
      uVar8 = uVar13 | 0x10000000000000;
      if (bVar18) {
        uVar8 = uVar13;
      }
      iVar6 = (uint)((ulong)value >> 0x34) - 0x433;
      if (bVar18) {
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        uVar8 = uVar8 << (~(byte)lVar9 + 0x35 & 0x3f);
        iVar6 = -0x427 - ((uint)lVar9 ^ 0x3f);
      }
      iVar4 = (int)((ulong)((long)(-0x32 - iVar6) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar12 = iVar4 + 0x15b;
      uVar17 = iVar4 + 0x162;
      if (-1 < (int)uVar12) {
        uVar17 = uVar12;
      }
      local_40 = (ulong)(uVar17 & 0xfffffff8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar8 << 0xb;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(basic_data<void>::grisu_pow10_significands +
                               (long)((int)uVar17 >> 3) * 8 + 8);
      uVar8 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
      bVar11 = -((char)*(undefined2 *)
                        (basic_data<void>::grisu_pow10_exponents + (long)((int)uVar17 >> 3) * 2 + 2)
                + (char)iVar6) - 0x35;
      local_78.precision = 0x2ff;
      if (precision < 0x2ff) {
        local_78.precision = precision;
      }
      local_78.buf = buf->ptr_;
      local_78.size = 0;
      local_78.exp10 = 0x154 - (uVar17 & 0xfffffff8);
      local_50 = 1L << (bVar11 & 0x3f);
      uVar13 = uVar8 >> (bVar11 & 0x3f);
      uVar17 = (uint)uVar13;
      if (uVar17 == 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      local_58 = buf;
      local_38 = value;
      if (uVar13 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      uVar12 = 0x1f;
      if ((uVar17 | 1) != 0) {
        for (; (uVar17 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      lVar9 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar12 * 2) -
              (ulong)(uVar17 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar12 * 2)
                                        * 4));
      local_7c = (int)lVar9;
      rVar7 = fixed_handler::on_start
                        (&local_78,
                         *(long *)("fmt::detail::bigint::~bigint()" + lVar9 * 8 + 0x17) <<
                         (bVar11 & 0x3f),uVar8 / 10,10,&local_7c);
      if (rVar7 == more) {
        local_48 = local_50 - 1;
        uVar8 = uVar8 & local_48;
        do {
          lVar9 = (long)local_7c;
          switch(local_7c) {
          case 1:
            cVar15 = (char)uVar13;
            uVar13 = 0;
            goto LAB_003bccb0;
          case 2:
            cVar15 = (char)((uVar13 & 0xffffffff) / 10);
            iVar6 = (int)((uVar13 & 0xffffffff) / 10) * 10;
            break;
          case 3:
            cVar15 = (char)((uVar13 & 0xffffffff) / 100);
            iVar6 = (int)((uVar13 & 0xffffffff) / 100) * 100;
            break;
          case 4:
            cVar15 = (char)((uVar13 & 0xffffffff) / 1000);
            iVar6 = (int)((uVar13 & 0xffffffff) / 1000) * 1000;
            break;
          case 5:
            cVar15 = (char)((uVar13 & 0xffffffff) / 10000);
            iVar6 = (int)((uVar13 & 0xffffffff) / 10000) * 10000;
            break;
          case 6:
            uVar16 = uVar13 >> 5 & 0x7ffffff;
            cVar15 = (char)(uVar16 / 0xc35);
            iVar6 = (int)(uVar16 / 0xc35) * 100000;
            break;
          case 7:
            cVar15 = (char)((uVar13 & 0xffffffff) / 1000000);
            iVar6 = (int)((uVar13 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 8:
            cVar15 = (char)((uVar13 & 0xffffffff) / 10000000);
            iVar6 = (int)((uVar13 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 9:
            cVar15 = (char)((uVar13 & 0xffffffff) / 100000000);
            iVar6 = (int)((uVar13 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 10:
            uVar16 = (uVar13 >> 9 & 0x7fffff) * 0x44b83;
            cVar15 = (char)(uVar16 >> 0x27);
            iVar6 = (uint)(uVar16 >> 0x27) * 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          uVar13 = (ulong)(uint)((int)uVar13 - iVar6);
LAB_003bccb0:
          local_7c = local_7c + -1;
          rVar7 = fixed_handler::on_digit
                            (&local_78,cVar15 + '0',
                             *(long *)("fmt::detail::bigint::~bigint()" + lVar9 * 8 + 0x17) <<
                             (bVar11 & 0x3f),(uVar13 << (bVar11 & 0x3f)) + uVar8,1,local_7c,true);
          divisor = local_50;
          if (rVar7 != more) goto LAB_003bcd6e;
        } while (0 < local_7c);
        error = 1;
        do {
          uVar13 = uVar8 * 10;
          error = error * 10;
          uVar8 = uVar13 & local_48;
          local_7c = local_7c + -1;
          rVar7 = fixed_handler::on_digit
                            (&local_78,(char)(uVar13 >> (bVar11 & 0x3f)) + '0',divisor,uVar8,error,
                             local_7c,false);
        } while (rVar7 == more);
      }
LAB_003bcd6e:
      pbVar5 = local_58;
      uVar8 = local_60;
      if (rVar7 == error) {
        local_7c = local_7c + (local_78.size - ((int)local_40 + 8)) + 0x15b;
        fallback_format<double>
                  (local_38,local_78.precision,(bool)((byte)(local_60 >> 0x12) & 1),local_58,
                   &local_7c);
      }
      else {
        local_7c = local_7c + local_78.exp10;
        uVar13 = (ulong)local_78.size;
        if ((long)uVar13 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        if (local_58->capacity_ < uVar13) {
          (**local_58->_vptr_buffer)(local_58,uVar13);
        }
        if (pbVar5->capacity_ < uVar13) {
          uVar13 = pbVar5->capacity_;
        }
        pbVar5->size_ = uVar13;
      }
      if (((uint)uVar8 >> 0x14 & 1) == 0 && uVar14 != 0x200000000) {
        uVar14 = pbVar5->size_;
        if (uVar14 != 0) {
          do {
            iVar6 = local_7c + 1;
            if (pbVar5->ptr_[uVar14 - 1] != '0') goto LAB_003bce9f;
            uVar14 = uVar14 - 1;
            local_7c = iVar6;
          } while (uVar14 != 0);
          uVar14 = 0;
        }
LAB_003bce9f:
        if (pbVar5->capacity_ < uVar14) {
          (**pbVar5->_vptr_buffer)(pbVar5,uVar14);
        }
        if (pbVar5->capacity_ < uVar14) {
          uVar14 = pbVar5->capacity_;
        }
        pbVar5->size_ = uVar14;
      }
    }
  }
  return local_7c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}